

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.h
# Opt level: O3

void __thiscall hwnet::TCPListener::~TCPListener(TCPListener *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_00123bc0;
  (this->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_00123bf8;
  p_Var2 = (this->onError_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->onError_,(_Any_data *)&this->onError_,__destroy_functor);
  }
  p_Var2 = (this->onNewConn_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->onNewConn_,(_Any_data *)&this->onNewConn_,__destroy_functor);
  }
  p_Var3 = (this->super_enable_shared_from_this<hwnet::TCPListener>)._M_weak_this.
           super___weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~TCPListener(){}